

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O3

string * __thiscall
DSDcc::Locator::toString_abi_cxx11_(string *__return_storage_ptr__,Locator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  return __return_storage_ptr__;
}

Assistant:

std::string Locator::toString() const
{
  std::string returned = "";

  returned.append(1,m_lon_array1[m_lon_index1]);
  returned.append(1,m_lat_array1[m_lat_index1]);
  returned.append(1,m_lon_array2[m_lon_index2]);
  returned.append(1,m_lat_array2[m_lat_index2]);
  returned.append(1,m_lon_array3[m_lon_index3]);
  returned.append(1,m_lat_array3[m_lat_index3]);

  return returned;
}